

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<float>>
               (char *label_id,GetterXsYs<float> *getter,double width)

{
  ImPlotNextItemData *col;
  float fVar1;
  bool bVar2;
  ImPlotContext *pIVar3;
  bool bVar4;
  ImU32 col_00;
  ImU32 col_01;
  long lVar5;
  ImDrawList *this;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_48;
  ImVec2 local_38;
  
  bVar4 = BeginItem(label_id,1);
  if (bVar4) {
    dVar8 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar6 = getter->Count, 0 < iVar6)) {
      iVar7 = 0;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        dVar9 = (double)*(float *)((long)getter->Xs + lVar5);
        local_48.y = (double)*(float *)((long)getter->Ys + lVar5);
        local_48.x = dVar9 - dVar8;
        FitPoint(&local_48);
        local_48.x = dVar9 + dVar8;
        local_48.y = 0.0;
        FitPoint(&local_48);
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
    pIVar3 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar3->NextItemData).Colors + 1);
    iVar6 = getter->Count;
    if (0 < iVar6) {
      bVar4 = (pIVar3->NextItemData).RenderFill;
      bVar2 = (pIVar3->NextItemData).RenderLine;
      iVar7 = 0;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        fVar1 = *(float *)((long)getter->Ys + lVar5);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          dVar9 = (double)*(float *)((long)getter->Xs + lVar5);
          local_48.x = (double)PlotToPixels(dVar9 - dVar8,(double)fVar1,-1);
          local_38 = PlotToPixels(dVar9 + dVar8,0.0,-1);
          if ((pIVar3->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_48,&local_38,col_01,0.0,0xf);
          }
          if (((bVar4 ^ 1U | col_00 != col_01) & bVar2) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_48,&local_38,col_00,0.0,0xf,
                                (pIVar3->NextItemData).LineWeight);
          }
        }
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
    pIVar3 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar3->NextItemData);
    pIVar3->PreviousItem = pIVar3->CurrentItem;
    pIVar3->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}